

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

ptr __thiscall
gch::detail::small_vector_base<std::allocator<std::pair<int,double>>,256u>::
emplace_into_current_end<std::pair<int,double>>
          (small_vector_base<std::allocator<std::pair<int,_double>_>,_256U> *this,
          pair<int,_double> *args)

{
  ptr ppVar1;
  size_ty sVar2;
  double dVar3;
  undefined4 uVar4;
  difference_type __d;
  
  uVar4 = *(undefined4 *)&args->field_0x4;
  dVar3 = args->second;
  ppVar1 = (this->m_data).super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.
           m_data_ptr +
           (this->m_data).super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.
           m_size;
  ppVar1->first = args->first;
  *(undefined4 *)&ppVar1->field_0x4 = uVar4;
  ppVar1->second = dVar3;
  ppVar1 = (this->m_data).super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.
           m_data_ptr;
  sVar2 = (this->m_data).super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.
          m_size;
  (this->m_data).super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_size =
       sVar2 + 1;
  return ppVar1 + sVar2;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }